

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

double ON_MeshParameters::ToleranceFromObjectSize(double relative_tolerance,double actual_size)

{
  bool bVar1;
  double dVar2;
  
  bVar1 = ON_IsValid(relative_tolerance);
  dVar2 = 0.0;
  if (bVar1) {
    bVar1 = ON_IsValid(actual_size);
    dVar2 = 0.0;
    if (((0.0 < actual_size) && (0.0 < relative_tolerance)) && (bVar1)) {
      dVar2 = 1.0;
      if (relative_tolerance <= 1.0) {
        dVar2 = relative_tolerance;
      }
      if (0.5 <= dVar2) {
        dVar2 = dVar2 + dVar2 + 2.0;
      }
      else {
        dVar2 = (dVar2 * -4.0 + 6.0) * dVar2 + 1.0;
      }
      dVar2 = pow(10.0,-dVar2);
      dVar2 = dVar2 * actual_size;
    }
  }
  return dVar2;
}

Assistant:

double ON_MeshParameters::ToleranceFromObjectSize(
  double relative_tolerance,
  double actual_size
)
{
  // min_rel_tol creates the most facets
  //const double min_rel_tol = 5.0e-5;

  //max rel tol creates the fewest facets
  //const double max_rel_tol = 0.1;
  //m_relative_tolerance = 0.0;
  //if ( relative_tolerance <= 0.0 )
  //  m_relative_tolerance = max_rel_tol;
  //else if ( relative_tolerance >= 1.0 )
  //  m_relative_tolerance = min_rel_tol;
  //else
  //{
  //  ON_Interval e(log10(max_rel_tol),log10(min_rel_tol));
  //  m_relative_tolerance = pow(10.0,e.ParameterAt(relative_tolerance));
  //}

  double tol = 0.0;
  double x, e;
  if ( ON_IsValid(relative_tolerance) && ON_IsValid(actual_size)
       && relative_tolerance > 0.0 && actual_size > 0.0 )
  {
    if ( relative_tolerance > 1.0 )
      relative_tolerance = 1.0;

    //e = (relative_tolerance*(12.0 + relative_tolerance*(2.0*relative_tolerance - 9.0)));
    //e = (1.0 + relative_tolerance*(8.0 - 4.0*relative_tolerance));
    //e = 1.0 + relative_tolerance*4.0;
    //x = 5.0*pow(10.0,-e);

    e = (relative_tolerance < 0.5) 
      ? 1.0 + relative_tolerance*(6.0 - 4.0*relative_tolerance) // 1.0 + 4.0*relative_tolerance
      : 2.0 + 2.0*relative_tolerance;
    x = pow(10.0,-e);

    tol = actual_size*x;
  }
  return tol;
}